

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPlateType::~IfcPlateType(IfcPlateType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x9047a8;
  *(undefined8 *)&this->field_0x30 = 0x9048c0;
  *(undefined8 *)&this[-1].field_0xd0 = 0x9047d0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x9047f8;
  *(undefined8 *)&this[-1].field_0x138 = 0x904820;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x904848;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x904870;
  *(undefined8 *)this = 0x904898;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x904b88;
  *(undefined8 *)&this->field_0x30 = 0x904c50;
  *(undefined8 *)&this[-1].field_0xd0 = 0x904bb0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x904bd8;
  *(undefined8 *)&this[-1].field_0x138 = 0x904c00;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x904c28;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>.field_0x20)
  {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__009048e8);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcPlateType() : Object("IfcPlateType") {}